

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PMAPPED_VIEW_LIST MAPGetViewForAddress(LPCVOID lpAddress)

{
  PMAPPED_VIEW_LIST pView;
  LIST_ENTRY *pLink;
  LPCVOID lpAddress_local;
  
  if (lpAddress == (LPCVOID)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    for (pView = (PMAPPED_VIEW_LIST)MappedViewList.Flink;
        pView != (PMAPPED_VIEW_LIST)&MappedViewList; pView = (PMAPPED_VIEW_LIST)(pView->Link).Flink)
    {
      if (pView->lpAddress == lpAddress) {
        return pView;
      }
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  return (PMAPPED_VIEW_LIST)0x0;
}

Assistant:

static PMAPPED_VIEW_LIST MAPGetViewForAddress( LPCVOID lpAddress )
{       
    if ( NULL == lpAddress )
    {
        ERROR( "lpAddress cannot be NULL\n" );
        return NULL;
    }

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        if (pView->lpAddress == lpAddress)
        {
            return pView;
        }
    }
            
    WARN( "No match found.\n" );
    
    return NULL;
}